

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::anon_unknown_0::IsinfCaseInstance::getInputValues
          (IsinfCaseInstance *this,int numValues,void **values)

{
  char cVar1;
  pointer pSVar2;
  deUint32 dVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  float fVar8;
  Random rnd;
  deRandom local_40;
  
  dVar3 = deStringHash((this->super_CommonFunctionTestInstance).m_name);
  deRandom_init(&local_40,dVar3 ^ 0xc2a39f);
  pSVar2 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = *(uint *)((long)&(pSVar2->varType).m_data + 4);
  iVar4 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  cVar1 = (&DAT_00b5b32c)[(ulong)uVar5 * 4];
  if (0 < iVar4 * numValues) {
    uVar6 = 0;
    do {
      fVar8 = deRandom_getFloat(&local_40);
      uVar5 = 0x7f800000;
      if (fVar8 <= 0.3) {
        fVar8 = deRandom_getFloat(&local_40);
        dVar3 = deRandom_getUint32(&local_40);
        uVar7 = dVar3 & (0x3fffffU >> (0x17U - cVar1 & 0x1f)) << (0x17U - cVar1 & 0x1f) | 0x400000;
        if (fVar8 <= 0.4) {
          dVar3 = deRandom_getUint32(&local_40);
          uVar5 = (dVar3 & 0x7f) << 0x17;
        }
      }
      else {
        uVar7 = 0;
      }
      dVar3 = deRandom_getUint32(&local_40);
      *(deUint32 *)((long)*values + uVar6 * 4) = dVar3 << 0x1f | uVar5 | uVar7;
      uVar6 = uVar6 + 1;
    } while ((uint)(iVar4 * numValues) != uVar6);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd				(deStringHash(m_name) ^ 0xc2a39fu);
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				mantissaBits	= getMinMantissaBits(precision);
		const deUint32			mantissaMask	= ~getMaxUlpDiffFromBits(mantissaBits) & ((1u<<23)-1u);

		for (int valNdx = 0; valNdx < numValues*scalarSize; valNdx++)
		{
			const bool		isInf		= rnd.getFloat() > 0.3f;
			const bool		isNan		= !isInf && rnd.getFloat() > 0.4f;
			const deUint32	mantissa	= !isInf ? ((1u<<22) | (rnd.getUint32() & mantissaMask)) : 0;
			const deUint32	exp			= !isNan && !isInf ? (rnd.getUint32() & 0x7fu) : 0xffu;
			const deUint32	sign		= rnd.getUint32() & 0x1u;
			const deUint32	value		= (sign << 31) | (exp << 23) | mantissa;

			DE_ASSERT(tcu::Float32(value).isInf() == isInf && tcu::Float32(value).isNaN() == isNan);

			((deUint32*)values[0])[valNdx] = value;
		}
	}